

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_mini_table_oneof.cc
# Opt level: O1

void __thiscall
MiniTableOneofTest_InitialFieldOneOf_Test::TestBody(MiniTableOneofTest_InitialFieldOneOf_Test *this)

{
  upb_MiniTableField *f;
  upb_MiniTableField *puVar1;
  char *in_R9;
  AssertionResult gtest_ar_;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_50;
  AssertHelper local_48;
  internal local_40 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_38;
  string local_30;
  
  f = upb_MiniTable_FindFieldByNumber(&upb__test__TestOneOfInitialField_msg_init,1);
  local_40[0] = (internal)(f != (upb_MiniTableField *)0x0);
  local_38 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (f == (upb_MiniTableField *)0x0) {
    testing::Message::Message((Message *)&local_50);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_30,local_40,(AssertionResult *)0x47937c,"false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_48,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/test/test_mini_table_oneof.cc"
               ,0x21,local_30._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_50);
  }
  else {
    puVar1 = upb_MiniTable_GetOneof(&upb__test__TestOneOfInitialField_msg_init,f);
    local_40[0] = (internal)(puVar1 == f);
    local_38 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if ((bool)local_40[0]) goto LAB_001ab4d6;
    testing::Message::Message((Message *)&local_50);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_30,local_40,(AssertionResult *)"ptr == field","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/test/test_mini_table_oneof.cc"
               ,0x24,local_30._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_50);
  }
  testing::internal::AssertHelper::~AssertHelper(&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  if (local_50._M_head_impl !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    (**(code **)(*(long *)local_50._M_head_impl + 8))();
  }
LAB_001ab4d6:
  if (local_38 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_38,local_38);
  }
  return;
}

Assistant:

TEST(MiniTableOneofTest, InitialFieldOneOf) {
  const upb_MiniTable* table = &upb__test__TestOneOfInitialField_msg_init;
  const upb_MiniTableField* field = upb_MiniTable_FindFieldByNumber(table, 1);
  ASSERT_TRUE(field != nullptr);

  const upb_MiniTableField* ptr = upb_MiniTable_GetOneof(table, field);
  EXPECT_TRUE(ptr == field);
}